

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

OPJ_BOOL opj_pi_next_rlcp(opj_pi_iterator_t *pi)

{
  opj_pi_resolution_t *poVar1;
  uint uVar2;
  OPJ_UINT32 index;
  opj_pi_resolution_t *res;
  opj_pi_comp_t *comp;
  opj_pi_iterator_t *pi_local;
  
  if (((pi->poc).compno0 < pi->numcomps) && ((pi->poc).compno1 < pi->numcomps + 1)) {
    if (pi->first != 0) {
      pi->first = 0;
      pi->resno = (pi->poc).resno0;
      goto LAB_001473a7;
    }
    do {
      pi->precno = pi->precno + 1;
      while ((pi->poc).precno1 <= pi->precno) {
        do {
          pi->compno = pi->compno + 1;
          while ((pi->poc).compno1 <= pi->compno) {
            pi->layno = pi->layno + 1;
            while ((pi->poc).layno1 <= pi->layno) {
              pi->resno = pi->resno + 1;
LAB_001473a7:
              if ((pi->poc).resno1 <= pi->resno) {
                return 0;
              }
              pi->layno = (pi->poc).layno0;
            }
            pi->compno = (pi->poc).compno0;
          }
        } while (pi->comps[pi->compno].numresolutions <= pi->resno);
        poVar1 = pi->comps[pi->compno].resolutions;
        if (pi->tp_on == '\0') {
          (pi->poc).precno1 = poVar1[pi->resno].pw * poVar1[pi->resno].ph;
        }
        pi->precno = (pi->poc).precno0;
      }
      uVar2 = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c +
              pi->precno * pi->step_p;
      if (pi->include_size <= uVar2) {
        opj_event_msg(pi->manager,1,"Invalid access to pi->include");
        return 0;
      }
    } while (pi->include[uVar2] != 0);
    pi->include[uVar2] = 1;
    pi_local._4_4_ = 1;
  }
  else {
    opj_event_msg(pi->manager,1,"opj_pi_next_rlcp(): invalid compno0/compno1\n");
    pi_local._4_4_ = 0;
  }
  return pi_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_pi_next_rlcp(opj_pi_iterator_t * pi)
{
    opj_pi_comp_t *comp = NULL;
    opj_pi_resolution_t *res = NULL;
    OPJ_UINT32 index = 0;

    if (pi->poc.compno0 >= pi->numcomps ||
            pi->poc.compno1 >= pi->numcomps + 1) {
        opj_event_msg(pi->manager, EVT_ERROR,
                      "opj_pi_next_rlcp(): invalid compno0/compno1\n");
        return OPJ_FALSE;
    }

    if (!pi->first) {
        comp = &pi->comps[pi->compno];
        res = &comp->resolutions[pi->resno];
        goto LABEL_SKIP;
    } else {
        pi->first = 0;
    }

    for (pi->resno = pi->poc.resno0; pi->resno < pi->poc.resno1; pi->resno++) {
        for (pi->layno = pi->poc.layno0; pi->layno < pi->poc.layno1; pi->layno++) {
            for (pi->compno = pi->poc.compno0; pi->compno < pi->poc.compno1; pi->compno++) {
                comp = &pi->comps[pi->compno];
                if (pi->resno >= comp->numresolutions) {
                    continue;
                }
                res = &comp->resolutions[pi->resno];
                if (!pi->tp_on) {
                    pi->poc.precno1 = res->pw * res->ph;
                }
                for (pi->precno = pi->poc.precno0; pi->precno < pi->poc.precno1; pi->precno++) {
                    index = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno *
                            pi->step_c + pi->precno * pi->step_p;
                    if (index >= pi->include_size) {
                        opj_event_msg(pi->manager, EVT_ERROR, "Invalid access to pi->include");
                        return OPJ_FALSE;
                    }
                    if (!pi->include[index]) {
                        pi->include[index] = 1;
                        return OPJ_TRUE;
                    }
LABEL_SKIP:
                    ;
                }
            }
        }
    }

    return OPJ_FALSE;
}